

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3MemRealloc(void *pPrior,int nByte)

{
  uint uVar1;
  uint in_ESI;
  void *in_RDI;
  sqlite3_int64 *p;
  long *local_18;
  
  local_18 = (long *)realloc((void *)((long)in_RDI + -8),(long)(int)(in_ESI + 8));
  if (local_18 == (long *)0x0) {
    uVar1 = sqlite3MemSize(in_RDI);
    sqlite3_log(7,"failed memory resize %u to %u bytes",(ulong)uVar1,(ulong)in_ESI);
    local_18 = (long *)0x0;
  }
  else {
    *local_18 = (long)(int)in_ESI;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

static void *sqlite3MemRealloc(void *pPrior, int nByte){
#ifdef SQLITE_MALLOCSIZE
  void *p = SQLITE_REALLOC(pPrior, nByte);
  if( p==0 ){
    testcase( sqlite3GlobalConfig.xLog!=0 );
    sqlite3_log(SQLITE_NOMEM,
      "failed memory resize %u to %u bytes",
      SQLITE_MALLOCSIZE(pPrior), nByte);
  }
  return p;
#else
  sqlite3_int64 *p = (sqlite3_int64*)pPrior;
  assert( pPrior!=0 && nByte>0 );
  assert( nByte==ROUND8(nByte) ); /* EV: R-46199-30249 */
  p--;
  p = SQLITE_REALLOC(p, nByte+8 );
  if( p ){
    p[0] = nByte;
    p++;
  }else{
    testcase( sqlite3GlobalConfig.xLog!=0 );
    sqlite3_log(SQLITE_NOMEM,
      "failed memory resize %u to %u bytes",
      sqlite3MemSize(pPrior), nByte);
  }
  return (void*)p;
#endif
}